

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O3

void http_txn_reap(void *arg)

{
  nni_aio_stop((nni_aio *)arg);
  if ((*(long *)((long)arg + 0x1e0) != 0) &&
     (*(nni_http_conn **)((long)arg + 0x1e8) != (nni_http_conn *)0x0)) {
    nni_http_conn_fini(*(nni_http_conn **)((long)arg + 0x1e8));
    *(undefined8 *)((long)arg + 0x1e8) = 0;
  }
  nni_http_chunks_free(*(nni_http_chunks **)((long)arg + 0x1f8));
  nni_aio_fini((nni_aio *)arg);
  nni_free(arg,0x210);
  return;
}

Assistant:

static void
http_txn_reap(void *arg)
{
	http_txn *txn = arg;

	nni_aio_stop(&txn->aio);
	if (txn->client != NULL) {
		// We only close the connection if we created it.
		if (txn->conn != NULL) {
			nni_http_conn_fini(txn->conn);
			txn->conn = NULL;
		}
	}
	nni_http_chunks_free(txn->chunks);
	nni_aio_fini(&txn->aio);
	NNI_FREE_STRUCT(txn);
}